

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicAllTargetsStore::Run(BasicAllTargetsStore *this)

{
  CallLogWrapper *this_00;
  _func_int **pp_Var1;
  bool bVar2;
  GLuint GVar3;
  ostream *poVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  Vector<float,_4> *pVVar8;
  Vector<float,_4> *v;
  Vector<int,_4> *v_00;
  Vector<int,_4> *v_01;
  Vector<unsigned_int,_4> *v_02;
  Vector<unsigned_int,_4> *v_03;
  int i;
  int required;
  long lVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  bool bVar11;
  Vector<float,_4> local_3b8;
  string local_3a8;
  GLuint textures [1];
  char local_378;
  undefined1 uStack_377;
  undefined6 uStack_376;
  GLint isamples;
  undefined8 uStack_360;
  char local_358;
  undefined1 uStack_357;
  undefined6 uStack_356;
  char *local_348;
  undefined8 uStack_340;
  char local_338;
  undefined1 uStack_337;
  undefined6 uStack_336;
  char *local_328;
  undefined8 local_320;
  char local_318;
  undefined1 uStack_317;
  undefined6 uStack_316;
  char *local_308;
  undefined8 local_300;
  char local_2f8;
  undefined1 uStack_2f7;
  undefined6 uStack_2f6;
  char *local_2e8;
  undefined8 local_2e0;
  char local_2d8;
  undefined1 uStack_2d7;
  undefined6 uStack_2d6;
  char *local_2c8;
  undefined8 local_2c0;
  char local_2b8;
  undefined1 uStack_2b7;
  undefined6 uStack_2b6;
  char *local_2a8;
  undefined8 local_2a0;
  char local_298;
  undefined1 uStack_297;
  undefined6 uStack_296;
  char *local_288;
  undefined8 local_280;
  char local_278;
  undefined1 uStack_277;
  undefined6 uStack_276;
  char *local_268;
  undefined8 local_260;
  char local_258;
  undefined1 uStack_257;
  undefined6 uStack_256;
  char *local_248;
  undefined8 local_240;
  char local_238;
  undefined1 uStack_237;
  undefined6 uStack_236;
  char *local_228;
  undefined8 local_220;
  char local_218;
  undefined1 uStack_217;
  undefined6 uStack_216;
  char *local_208;
  undefined8 local_200;
  char local_1f8;
  undefined1 uStack_1f7;
  undefined6 uStack_1f6;
  GLuint *local_1e8;
  long *local_1e0;
  long local_1d0 [2];
  char *local_1bc;
  undefined8 uStack_1b4;
  GLuint local_1ac;
  ostringstream os;
  
  pVVar8 = (Vector<float,_4> *)0x0;
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
  os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x40000000bf800000;
  os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0xc080000040400000;
  local_3a8._M_dataplus._M_p = (pointer)0x40000000bf800000;
  local_3a8._M_string_length = 0xc080000040400000;
  bVar2 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::Write<tcu::Vector<float,4>>
                    ((BasicAllTargetsStore *)this,(GLenum)&os,(Vector<float,_4> *)&local_3a8,pVVar8)
  ;
  if (bVar2) {
    os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0xfffffffe00000001;
    os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0xfffffffc00000003;
    local_3a8._M_dataplus._M_p = (pointer)0xfffffffe00000001;
    local_3a8._M_string_length = 0xfffffffc00000003;
    bVar2 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::Write<tcu::Vector<int,4>>
                      ((BasicAllTargetsStore *)this,(GLenum)&os,(Vector<int,_4> *)&local_3a8,
                       (Vector<int,_4> *)pVVar8);
    if (bVar2) {
      os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x200000001;
      os.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = TYPE_FLOAT_VEC3;
      os.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = TYPE_FLOAT_VEC4;
      local_3a8._M_dataplus._M_p = (pointer)0x200000001;
      local_3a8._M_string_length._0_4_ = TYPE_FLOAT_VEC3;
      local_3a8._M_string_length._4_4_ = TYPE_FLOAT_VEC4;
      bVar2 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::
              Write<tcu::Vector<unsigned_int,4>>
                        ((BasicAllTargetsStore *)this,(GLenum)&os,
                         (Vector<unsigned_int,_4> *)&local_3a8,(Vector<unsigned_int,_4> *)pVVar8);
      if (bVar2) {
        local_3b8.m_data[0] = -1.0;
        local_3b8.m_data[1] = 2.0;
        local_3b8.m_data[2] = 3.0;
        local_3b8.m_data[3] = -4.0;
        local_1bc = (char *)0x40000000bf800000;
        uStack_1b4 = 0xc080000040400000;
        local_1e8 = &this->m_vao;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&os,"#version 420 core\nlayout(",0x19);
        paVar10 = &local_3a8.field_2;
        local_3a8._M_string_length = 7;
        local_3a8.field_2._M_allocated_capacity = 0x66323361626772;
        local_3a8._M_dataplus._M_p = (pointer)paVar10;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                            paVar10->_M_local_buf,7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
        uStack_360 = 0;
        local_358 = '\0';
        _isamples = &local_358;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_358,0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,
                   "imageCubeArray g_image_cube_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_cube_array, ivec3(coord, 0), "
                   ,0x8b);
        uStack_340 = 0;
        local_338 = '\0';
        local_348 = &local_338;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_338,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
        poVar4 = tcu::operator<<(poVar4,&local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 1), ",0x35);
        _textures = &local_378;
        local_378 = '\0';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,_textures,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
        poVar4 = tcu::operator<<(poVar4,&local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 2), ",0x35);
        local_208 = &local_1f8;
        local_200 = 0;
        local_1f8 = '\0';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_208,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
        poVar4 = tcu::operator<<(poVar4,&local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 3), ",0x35);
        local_228 = &local_218;
        local_220 = 0;
        local_218 = '\0';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_228,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
        poVar4 = tcu::operator<<(poVar4,&local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 4), ",0x35);
        local_248 = &local_238;
        local_240 = 0;
        local_238 = '\0';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_248,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
        poVar4 = tcu::operator<<(poVar4,&local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 5), ",0x35);
        local_268 = &local_258;
        local_260 = 0;
        local_258 = '\0';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_268,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
        poVar4 = tcu::operator<<(poVar4,&local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 6), ",0x35);
        local_288 = &local_278;
        local_280 = 0;
        local_278 = '\0';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_288,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
        poVar4 = tcu::operator<<(poVar4,&local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 7), ",0x35);
        local_2a8 = &local_298;
        local_2a0 = 0;
        local_298 = '\0';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a8,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
        poVar4 = tcu::operator<<(poVar4,&local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 8), ",0x35);
        local_2c8 = &local_2b8;
        local_2c0 = 0;
        local_2b8 = '\0';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2c8,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
        poVar4 = tcu::operator<<(poVar4,&local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 9), ",0x35);
        local_2e8 = &local_2d8;
        local_2e0 = 0;
        local_2d8 = '\0';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2e8,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
        poVar4 = tcu::operator<<(poVar4,&local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 10), ",0x36);
        local_308 = &local_2f8;
        local_300 = 0;
        local_2f8 = '\0';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_308,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
        poVar4 = tcu::operator<<(poVar4,&local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 11), ",0x36);
        local_328 = &local_318;
        local_320 = 0;
        local_318 = '\0';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_328,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
        poVar4 = tcu::operator<<(poVar4,&local_3b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n  discard;\n}",0xf);
        if (local_328 != &local_318) {
          operator_delete(local_328,CONCAT62(uStack_316,CONCAT11(uStack_317,local_318)) + 1);
        }
        if (local_308 != &local_2f8) {
          operator_delete(local_308,CONCAT62(uStack_2f6,CONCAT11(uStack_2f7,local_2f8)) + 1);
        }
        if (local_2e8 != &local_2d8) {
          operator_delete(local_2e8,CONCAT62(uStack_2d6,CONCAT11(uStack_2d7,local_2d8)) + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,CONCAT62(uStack_2b6,CONCAT11(uStack_2b7,local_2b8)) + 1);
        }
        if (local_2a8 != &local_298) {
          operator_delete(local_2a8,CONCAT62(uStack_296,CONCAT11(uStack_297,local_298)) + 1);
        }
        if (local_288 != &local_278) {
          operator_delete(local_288,CONCAT62(uStack_276,CONCAT11(uStack_277,local_278)) + 1);
        }
        if (local_268 != &local_258) {
          operator_delete(local_268,CONCAT62(uStack_256,CONCAT11(uStack_257,local_258)) + 1);
        }
        if (local_248 != &local_238) {
          operator_delete(local_248,CONCAT62(uStack_236,CONCAT11(uStack_237,local_238)) + 1);
        }
        if (local_228 != &local_218) {
          operator_delete(local_228,CONCAT62(uStack_216,CONCAT11(uStack_217,local_218)) + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,CONCAT62(uStack_1f6,CONCAT11(uStack_1f7,local_1f8)) + 1);
        }
        if (_textures != &local_378) {
          operator_delete(_textures,CONCAT62(uStack_376,CONCAT11(uStack_377,local_378)) + 1);
        }
        if (local_348 != &local_338) {
          operator_delete(local_348,CONCAT62(uStack_336,CONCAT11(uStack_337,local_338)) + 1);
        }
        if (_isamples != &local_358) {
          operator_delete(_isamples,CONCAT62(uStack_356,CONCAT11(uStack_357,local_358)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != paVar10) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
        std::ios_base::~ios_base
                  ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        GVar3 = ShaderImageLoadStoreBase::BuildProgram
                          (&this->super_ShaderImageLoadStoreBase,
                           "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                           ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1e0,(bool *)0x0);
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
        this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                   super_CallLogWrapper;
        glu::CallLogWrapper::glGenTextures(this_00,1,textures);
        pvVar5 = operator_new(0xc000);
        memset(pvVar5,0,0xc000);
        glu::CallLogWrapper::glBindTexture(this_00,0x9009,textures[0]);
        glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2801,0x2601);
        glu::CallLogWrapper::glTexImage3D
                  (this_00,0x9009,0,0x8814,0x10,0x10,0xc,0,0x1908,0x1406,pvVar5);
        glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
        glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[0],0,'\x01',0,0x88b9,0x8814);
        glu::CallLogWrapper::glUseProgram(this_00,GVar3);
        glu::CallLogWrapper::glBindVertexArray(this_00,*local_1e8);
        glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
        glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
        memset(pvVar5,0,0xc000);
        glu::CallLogWrapper::glBindTexture(this_00,0x9009,textures[0]);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
        glu::CallLogWrapper::glGetTexImage(this_00,0x9009,0,0x1908,0x1406,pvVar5);
        glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
        uVar7 = 0;
        bVar2 = false;
        pvVar6 = pvVar5;
        do {
          pVVar8 = (Vector<float,_4> *)(uVar7 * 0x10 + (long)pvVar5);
          bVar11 = true;
          lVar9 = 0;
          do {
            if (bVar11) {
              bVar11 = *(float *)((long)&local_1bc + lVar9 * 4) ==
                       *(float *)((long)pvVar6 + lVar9 * 4);
            }
            else {
              bVar11 = false;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          if (!bVar11) {
            _isamples = *(char **)pVVar8->m_data;
            uStack_360 = *(undefined8 *)(pVVar8->m_data + 2);
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                      ((string *)&os,&isamples,pVVar8);
            pp_Var1 = os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
            local_348 = local_1bc;
            uStack_340 = uStack_1b4;
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                      (&local_3a8,&local_348,v);
            anon_unknown_0::Output
                      ("GL_TEXTURE_CUBE_MAP_ARRAY target failed. Value is: %s. Value should be: %s.\n"
                       ,pp_Var1,local_3a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
            }
            if (os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
              operator_delete(os.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            break;
          }
          bVar2 = 0xbfe < uVar7;
          uVar7 = uVar7 + 1;
          pvVar6 = (void *)((long)pvVar6 + 0x10);
        } while (uVar7 != 0xc00);
        paVar10 = &local_3a8.field_2;
        glu::CallLogWrapper::glDeleteTextures(this_00,1,textures);
        glu::CallLogWrapper::glUseProgram(this_00,0);
        glu::CallLogWrapper::glDeleteProgram(this_00,GVar3);
        operator_delete(pvVar5,0xc000);
        if (bVar2) {
          local_3b8.m_data[0] = 1.4013e-45;
          local_3b8.m_data[1] = -NAN;
          local_3b8.m_data[2] = 4.2039e-45;
          local_3b8.m_data[3] = -NAN;
          local_1bc = (char *)0xfffffffe00000001;
          uStack_1b4 = 0xfffffffc00000003;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&os,"#version 420 core\nlayout(",0x19);
          local_3a8._M_string_length = 7;
          local_3a8.field_2._M_allocated_capacity = 0x69323361626772;
          local_3a8._M_dataplus._M_p = (pointer)paVar10;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                              paVar10->_M_local_buf,7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
          local_358 = 'i';
          uStack_357 = 0;
          uStack_360 = 1;
          _isamples = &local_358;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_358,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,
                     "imageCubeArray g_image_cube_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_cube_array, ivec3(coord, 0), "
                     ,0x8b);
          local_338 = 'i';
          uStack_337 = 0;
          uStack_340 = 1;
          local_348 = &local_338;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_338,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
          poVar4 = tcu::operator<<(poVar4,(Vector<int,_4> *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 1), ",0x35);
          _textures = &local_378;
          local_378 = 'i';
          uStack_377 = 0;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,_textures,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
          poVar4 = tcu::operator<<(poVar4,(Vector<int,_4> *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 2), ",0x35);
          local_208 = &local_1f8;
          local_1f8 = 'i';
          uStack_1f7 = 0;
          local_200 = 1;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_208,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
          poVar4 = tcu::operator<<(poVar4,(Vector<int,_4> *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 3), ",0x35);
          local_228 = &local_218;
          local_218 = 'i';
          uStack_217 = 0;
          local_220 = 1;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_228,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
          poVar4 = tcu::operator<<(poVar4,(Vector<int,_4> *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 4), ",0x35);
          local_248 = &local_238;
          local_238 = 'i';
          uStack_237 = 0;
          local_240 = 1;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_248,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
          poVar4 = tcu::operator<<(poVar4,(Vector<int,_4> *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 5), ",0x35);
          local_268 = &local_258;
          local_258 = 'i';
          uStack_257 = 0;
          local_260 = 1;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_268,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
          poVar4 = tcu::operator<<(poVar4,(Vector<int,_4> *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 6), ",0x35);
          local_288 = &local_278;
          local_278 = 'i';
          uStack_277 = 0;
          local_280 = 1;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_288,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
          poVar4 = tcu::operator<<(poVar4,(Vector<int,_4> *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 7), ",0x35);
          local_2a8 = &local_298;
          local_298 = 'i';
          uStack_297 = 0;
          local_2a0 = 1;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
          poVar4 = tcu::operator<<(poVar4,(Vector<int,_4> *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 8), ",0x35);
          local_2c8 = &local_2b8;
          local_2b8 = 'i';
          uStack_2b7 = 0;
          local_2c0 = 1;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2c8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
          poVar4 = tcu::operator<<(poVar4,(Vector<int,_4> *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 9), ",0x35);
          local_2e8 = &local_2d8;
          local_2d8 = 'i';
          uStack_2d7 = 0;
          local_2e0 = 1;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2e8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
          poVar4 = tcu::operator<<(poVar4,(Vector<int,_4> *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 10), ",0x36);
          local_308 = &local_2f8;
          local_2f8 = 'i';
          uStack_2f7 = 0;
          local_300 = 1;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_308,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
          poVar4 = tcu::operator<<(poVar4,(Vector<int,_4> *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 11), ",0x36);
          local_328 = &local_318;
          local_318 = 'i';
          uStack_317 = 0;
          local_320 = 1;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_328,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
          poVar4 = tcu::operator<<(poVar4,(Vector<int,_4> *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n  discard;\n}",0xf);
          if (local_328 != &local_318) {
            operator_delete(local_328,CONCAT62(uStack_316,CONCAT11(uStack_317,local_318)) + 1);
          }
          if (local_308 != &local_2f8) {
            operator_delete(local_308,CONCAT62(uStack_2f6,CONCAT11(uStack_2f7,local_2f8)) + 1);
          }
          if (local_2e8 != &local_2d8) {
            operator_delete(local_2e8,CONCAT62(uStack_2d6,CONCAT11(uStack_2d7,local_2d8)) + 1);
          }
          if (local_2c8 != &local_2b8) {
            operator_delete(local_2c8,CONCAT62(uStack_2b6,CONCAT11(uStack_2b7,local_2b8)) + 1);
          }
          if (local_2a8 != &local_298) {
            operator_delete(local_2a8,CONCAT62(uStack_296,CONCAT11(uStack_297,local_298)) + 1);
          }
          if (local_288 != &local_278) {
            operator_delete(local_288,CONCAT62(uStack_276,CONCAT11(uStack_277,local_278)) + 1);
          }
          if (local_268 != &local_258) {
            operator_delete(local_268,CONCAT62(uStack_256,CONCAT11(uStack_257,local_258)) + 1);
          }
          if (local_248 != &local_238) {
            operator_delete(local_248,CONCAT62(uStack_236,CONCAT11(uStack_237,local_238)) + 1);
          }
          if (local_228 != &local_218) {
            operator_delete(local_228,CONCAT62(uStack_216,CONCAT11(uStack_217,local_218)) + 1);
          }
          if (local_208 != &local_1f8) {
            operator_delete(local_208,CONCAT62(uStack_1f6,CONCAT11(uStack_1f7,local_1f8)) + 1);
          }
          if (_textures != &local_378) {
            operator_delete(_textures,CONCAT62(uStack_376,CONCAT11(uStack_377,local_378)) + 1);
          }
          if (local_348 != &local_338) {
            operator_delete(local_348,CONCAT62(uStack_336,CONCAT11(uStack_337,local_338)) + 1);
          }
          if (_isamples != &local_358) {
            operator_delete(_isamples,CONCAT62(uStack_356,CONCAT11(uStack_357,local_358)) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar10) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
          std::ios_base::~ios_base
                    ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
          GVar3 = ShaderImageLoadStoreBase::BuildProgram
                            (&this->super_ShaderImageLoadStoreBase,
                             "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                             ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1e0,(bool *)0x0);
          if (local_1e0 != local_1d0) {
            operator_delete(local_1e0,local_1d0[0] + 1);
          }
          glu::CallLogWrapper::glGenTextures(this_00,1,textures);
          pvVar5 = operator_new(0xc000);
          memset(pvVar5,0,0xc000);
          glu::CallLogWrapper::glBindTexture(this_00,0x9009,textures[0]);
          glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2801,0x2601);
          glu::CallLogWrapper::glTexImage3D
                    (this_00,0x9009,0,0x8d82,0x10,0x10,0xc,0,0x8d99,0x1404,pvVar5);
          glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
          glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[0],0,'\x01',0,0x88b9,0x8d82);
          glu::CallLogWrapper::glUseProgram(this_00,GVar3);
          glu::CallLogWrapper::glBindVertexArray(this_00,*local_1e8);
          glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
          glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
          memset(pvVar5,0,0xc000);
          glu::CallLogWrapper::glBindTexture(this_00,0x9009,textures[0]);
          glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
          glu::CallLogWrapper::glGetTexImage(this_00,0x9009,0,0x8d99,0x1404,pvVar5);
          glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
          uVar7 = 0;
          bVar2 = false;
          pvVar6 = pvVar5;
          do {
            v_00 = (Vector<int,_4> *)(uVar7 * 0x10 + (long)pvVar5);
            bVar11 = true;
            lVar9 = 0;
            do {
              if (bVar11) {
                bVar11 = *(int *)((long)pvVar6 + lVar9 * 4) ==
                         *(int *)((long)&local_1bc + lVar9 * 4);
              }
              else {
                bVar11 = false;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != 4);
            if (!bVar11) {
              _isamples = *(char **)v_00->m_data;
              uStack_360 = *(undefined8 *)(v_00->m_data + 2);
              local_1ac = GVar3;
              gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                        ((string *)&os,&isamples,v_00);
              pp_Var1 = os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
              local_348 = local_1bc;
              uStack_340 = uStack_1b4;
              gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                        (&local_3a8,&local_348,v_01);
              anon_unknown_0::Output
                        ("GL_TEXTURE_CUBE_MAP_ARRAY target failed. Value is: %s. Value should be: %s.\n"
                         ,pp_Var1,local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar10) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
              }
              GVar3 = local_1ac;
              if (os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
                operator_delete(os.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              break;
            }
            bVar2 = 0xbfe < uVar7;
            uVar7 = uVar7 + 1;
            pvVar6 = (void *)((long)pvVar6 + 0x10);
          } while (uVar7 != 0xc00);
          glu::CallLogWrapper::glDeleteTextures(this_00,1,textures);
          glu::CallLogWrapper::glUseProgram(this_00,0);
          glu::CallLogWrapper::glDeleteProgram(this_00,GVar3);
          operator_delete(pvVar5,0xc000);
          if (bVar2) {
            local_3b8.m_data[0] = 1.4013e-45;
            local_3b8.m_data[1] = 2.8026e-45;
            local_3b8.m_data[2] = 4.2039e-45;
            local_3b8.m_data[3] = 5.60519e-45;
            local_1bc = (char *)0x200000001;
            uStack_1b4._0_4_ = TYPE_FLOAT_VEC3;
            uStack_1b4._4_4_ = TYPE_FLOAT_VEC4;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&os,"#version 420 core\nlayout(",0x19);
            local_3a8.field_2._M_allocated_capacity = 0x6975323361626772;
            local_3a8._M_string_length = 8;
            local_3a8.field_2._M_local_buf[8] = '\0';
            local_3a8._M_dataplus._M_p = (pointer)paVar10;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                                paVar10->_M_local_buf,8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
            local_358 = 'u';
            uStack_357 = 0;
            uStack_360 = 1;
            _isamples = &local_358;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_358,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,
                       "imageCubeArray g_image_cube_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_cube_array, ivec3(coord, 0), "
                       ,0x8b);
            local_338 = 'u';
            uStack_337 = 0;
            uStack_340._0_4_ = TYPE_FLOAT;
            uStack_340._4_4_ = TYPE_INVALID;
            local_348 = &local_338;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_338,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
            poVar4 = tcu::operator<<(poVar4,(Vector<unsigned_int,_4> *)&local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 1), ",0x35);
            _textures = &local_378;
            local_378 = 'u';
            uStack_377 = 0;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,_textures,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
            poVar4 = tcu::operator<<(poVar4,(Vector<unsigned_int,_4> *)&local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 2), ",0x35);
            local_208 = &local_1f8;
            local_1f8 = 'u';
            uStack_1f7 = 0;
            local_200 = 1;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_208,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
            poVar4 = tcu::operator<<(poVar4,(Vector<unsigned_int,_4> *)&local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 3), ",0x35);
            local_228 = &local_218;
            local_218 = 'u';
            uStack_217 = 0;
            local_220 = 1;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_228,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
            poVar4 = tcu::operator<<(poVar4,(Vector<unsigned_int,_4> *)&local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 4), ",0x35);
            local_248 = &local_238;
            local_238 = 'u';
            uStack_237 = 0;
            local_240 = 1;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_248,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
            poVar4 = tcu::operator<<(poVar4,(Vector<unsigned_int,_4> *)&local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 5), ",0x35);
            local_268 = &local_258;
            local_258 = 'u';
            uStack_257 = 0;
            local_260 = 1;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_268,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
            poVar4 = tcu::operator<<(poVar4,(Vector<unsigned_int,_4> *)&local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 6), ",0x35);
            local_288 = &local_278;
            local_278 = 'u';
            uStack_277 = 0;
            local_280 = 1;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_288,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
            poVar4 = tcu::operator<<(poVar4,(Vector<unsigned_int,_4> *)&local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 7), ",0x35);
            local_2a8 = &local_298;
            local_298 = 'u';
            uStack_297 = 0;
            local_2a0 = 1;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a8,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
            poVar4 = tcu::operator<<(poVar4,(Vector<unsigned_int,_4> *)&local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 8), ",0x35);
            local_2c8 = &local_2b8;
            local_2b8 = 'u';
            uStack_2b7 = 0;
            local_2c0 = 1;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2c8,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
            poVar4 = tcu::operator<<(poVar4,(Vector<unsigned_int,_4> *)&local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 9), ",0x35);
            local_2e8 = &local_2d8;
            local_2d8 = 'u';
            uStack_2d7 = 0;
            local_2e0 = 1;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2e8,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
            poVar4 = tcu::operator<<(poVar4,(Vector<unsigned_int,_4> *)&local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 10), ",0x36);
            local_308 = &local_2f8;
            local_2f8 = 'u';
            uStack_2f7 = 0;
            local_300 = 1;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_308,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
            poVar4 = tcu::operator<<(poVar4,(Vector<unsigned_int,_4> *)&local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,");\n  imageStore(g_image_cube_array, ivec3(coord, 11), ",0x36);
            local_328 = &local_318;
            local_318 = 'u';
            uStack_317 = 0;
            local_320 = 1;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_328,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
            poVar4 = tcu::operator<<(poVar4,(Vector<unsigned_int,_4> *)&local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n  discard;\n}",0xf);
            if (local_328 != &local_318) {
              operator_delete(local_328,CONCAT62(uStack_316,CONCAT11(uStack_317,local_318)) + 1);
            }
            if (local_308 != &local_2f8) {
              operator_delete(local_308,CONCAT62(uStack_2f6,CONCAT11(uStack_2f7,local_2f8)) + 1);
            }
            if (local_2e8 != &local_2d8) {
              operator_delete(local_2e8,CONCAT62(uStack_2d6,CONCAT11(uStack_2d7,local_2d8)) + 1);
            }
            if (local_2c8 != &local_2b8) {
              operator_delete(local_2c8,CONCAT62(uStack_2b6,CONCAT11(uStack_2b7,local_2b8)) + 1);
            }
            if (local_2a8 != &local_298) {
              operator_delete(local_2a8,CONCAT62(uStack_296,CONCAT11(uStack_297,local_298)) + 1);
            }
            if (local_288 != &local_278) {
              operator_delete(local_288,CONCAT62(uStack_276,CONCAT11(uStack_277,local_278)) + 1);
            }
            if (local_268 != &local_258) {
              operator_delete(local_268,CONCAT62(uStack_256,CONCAT11(uStack_257,local_258)) + 1);
            }
            if (local_248 != &local_238) {
              operator_delete(local_248,CONCAT62(uStack_236,CONCAT11(uStack_237,local_238)) + 1);
            }
            if (local_228 != &local_218) {
              operator_delete(local_228,CONCAT62(uStack_216,CONCAT11(uStack_217,local_218)) + 1);
            }
            if (local_208 != &local_1f8) {
              operator_delete(local_208,CONCAT62(uStack_1f6,CONCAT11(uStack_1f7,local_1f8)) + 1);
            }
            if (_textures != &local_378) {
              operator_delete(_textures,CONCAT62(uStack_376,CONCAT11(uStack_377,local_378)) + 1);
            }
            if (local_348 != &local_338) {
              operator_delete(local_348,CONCAT62(uStack_336,CONCAT11(uStack_337,local_338)) + 1);
            }
            if (_isamples != &local_358) {
              operator_delete(_isamples,CONCAT62(uStack_356,CONCAT11(uStack_357,local_358)) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar10) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
            std::ios_base::~ios_base
                      ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
                      );
            GVar3 = ShaderImageLoadStoreBase::BuildProgram
                              (&this->super_ShaderImageLoadStoreBase,
                               "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                               ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1e0,(bool *)0x0);
            if (local_1e0 != local_1d0) {
              operator_delete(local_1e0,local_1d0[0] + 1);
            }
            glu::CallLogWrapper::glGenTextures(this_00,1,textures);
            pvVar5 = operator_new(0xc000);
            memset(pvVar5,0,0xc000);
            glu::CallLogWrapper::glBindTexture(this_00,0x9009,textures[0]);
            glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2801,0x2601);
            glu::CallLogWrapper::glTexImage3D
                      (this_00,0x9009,0,0x8d70,0x10,0x10,0xc,0,0x8d99,0x1405,pvVar5);
            glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
            glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[0],0,'\x01',0,0x88b9,0x8d70);
            glu::CallLogWrapper::glUseProgram(this_00,GVar3);
            glu::CallLogWrapper::glBindVertexArray(this_00,*local_1e8);
            glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
            glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
            memset(pvVar5,0,0xc000);
            glu::CallLogWrapper::glBindTexture(this_00,0x9009,textures[0]);
            glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
            glu::CallLogWrapper::glGetTexImage(this_00,0x9009,0,0x8d99,0x1405,pvVar5);
            glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
            pVVar8 = (Vector<float,_4> *)0x0;
            bVar2 = false;
            pvVar6 = pvVar5;
            do {
              v_02 = (Vector<unsigned_int,_4> *)((long)pVVar8 * 0x10 + (long)pvVar5);
              bVar11 = true;
              lVar9 = 0;
              do {
                if (bVar11) {
                  bVar11 = *(int *)((long)pvVar6 + lVar9 * 4) ==
                           *(int *)((long)&local_1bc + lVar9 * 4);
                }
                else {
                  bVar11 = false;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 != 4);
              if (!bVar11) {
                local_1e8 = (GLuint *)CONCAT44(local_1e8._4_4_,GVar3);
                _isamples = *(char **)v_02->m_data;
                uStack_360 = *(undefined8 *)(v_02->m_data + 2);
                gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
                ToString<tcu::Vector<unsigned_int,4>>((string *)&os,&isamples,v_02);
                pp_Var1 = os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
                local_348 = local_1bc;
                uStack_340._0_4_ = (DataType)uStack_1b4;
                uStack_340._4_4_ = uStack_1b4._4_4_;
                gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
                ToString<tcu::Vector<unsigned_int,4>>(&local_3a8,&local_348,v_03);
                anon_unknown_0::Output
                          ("GL_TEXTURE_CUBE_MAP_ARRAY target failed. Value is: %s. Value should be: %s.\n"
                           ,pp_Var1,local_3a8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a8._M_dataplus._M_p != paVar10) {
                  operator_delete(local_3a8._M_dataplus._M_p,
                                  local_3a8.field_2._M_allocated_capacity + 1);
                }
                GVar3 = (GLuint)local_1e8;
                if (os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                    (_func_int **)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
                {
                  operator_delete(os.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream,
                                  os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
                }
                break;
              }
              bVar2 = (Vector<float,_4> *)0xbfe < pVVar8;
              pVVar8 = (Vector<float,_4> *)((long)pVVar8->m_data + 1);
              pvVar6 = (void *)((long)pvVar6 + 0x10);
            } while (pVVar8 != (Vector<float,_4> *)0xc00);
            glu::CallLogWrapper::glDeleteTextures(this_00,1,textures);
            glu::CallLogWrapper::glUseProgram(this_00,0);
            glu::CallLogWrapper::glDeleteProgram(this_00,GVar3);
            required = 0xc000;
            operator_delete(pvVar5,0xc000);
            if (bVar2) {
              bVar2 = ShaderImageLoadStoreBase::SupportedSamples
                                (&this->super_ShaderImageLoadStoreBase,required);
              if (bVar2) {
                os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)0x40000000bf800000;
                os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0xc080000040400000;
                local_3a8._M_dataplus._M_p = (pointer)0x40000000bf800000;
                local_3a8._M_string_length = 0xc080000040400000;
                bVar2 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::
                        WriteMS<tcu::Vector<float,4>>
                                  ((BasicAllTargetsStore *)this,(GLenum)&os,
                                   (Vector<float,_4> *)&local_3a8,pVVar8);
                if (!bVar2) {
                  return -1;
                }
                glu::CallLogWrapper::glGetIntegerv(this_00,0x9110,&isamples);
                if (3 < isamples) {
                  os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                       (_func_int **)0xfffffffe00000001;
                  os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0xfffffffc00000003;
                  local_3a8._M_dataplus._M_p = (pointer)0xfffffffe00000001;
                  local_3a8._M_string_length = 0xfffffffc00000003;
                  bVar2 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::
                          WriteMS<tcu::Vector<int,4>>
                                    ((BasicAllTargetsStore *)this,(GLenum)&os,
                                     (Vector<int,_4> *)&local_3a8,(Vector<int,_4> *)pVVar8);
                  if (!bVar2) {
                    return -1;
                  }
                  os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                       (_func_int **)0x200000001;
                  os.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = TYPE_FLOAT_VEC3;
                  os.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = TYPE_FLOAT_VEC4;
                  local_3a8._M_dataplus._M_p = (pointer)0x200000001;
                  local_3a8._M_string_length._0_4_ = TYPE_FLOAT_VEC3;
                  local_3a8._M_string_length._4_4_ = TYPE_FLOAT_VEC4;
                  bVar2 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::
                          WriteMS<tcu::Vector<unsigned_int,4>>
                                    ((BasicAllTargetsStore *)this,(GLenum)&os,
                                     (Vector<unsigned_int,_4> *)&local_3a8,
                                     (Vector<unsigned_int,_4> *)pVVar8);
                  if (!bVar2) {
                    return -1;
                  }
                }
              }
              return 0;
            }
          }
        }
      }
    }
  }
  return -1;
}

Assistant:

virtual long Run()
	{
		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!Write(GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;

		if (!WriteCubeArray(GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!WriteCubeArray(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!WriteCubeArray(GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;

		if (SupportedSamples(4))
		{
			if (!WriteMS(GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
				return ERROR;

			GLint isamples;
			glGetIntegerv(GL_MAX_INTEGER_SAMPLES, &isamples);
			if (isamples >= 4)
			{
				if (!WriteMS(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
					return ERROR;
				if (!WriteMS(GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
					return ERROR;
			}
		}
		return NO_ERROR;
	}